

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picobench.cpp
# Opt level: O2

int main(void)

{
  initializer_list<int> __l;
  allocator_type local_d9;
  report rep;
  int local_b8 [2];
  runner run;
  
  picobench::runner::runner(&run,false);
  local_b8[0] = 100;
  local_b8[1] = 1000;
  __l._M_len = 2;
  __l._M_array = local_b8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&rep,__l,&local_d9);
  std::vector<int,_std::allocator<int>_>::operator=
            (&run._default_state_iterations,(vector<int,_std::allocator<int>_> *)&rep);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&rep);
  run._default_samples = 3;
  run._compare_results_across_samples = true;
  run._compare_results_across_benchmarks = true;
  picobench::runner::run_benchmarks(&run,0x7b);
  picobench::runner::generate_report<std::equal_to<long>>(&rep,&run);
  picobench::report::to_text(&rep,(ostream *)&std::cout);
  std::vector<picobench::report::suite,_std::allocator<picobench::report::suite>_>::~vector
            (&rep.suites);
  picobench::runner::~runner(&run);
  return run._error;
}

Assistant:

int main()
{
    runner run;

#if defined(NDEBUG)
    run.set_default_state_iterations({ 20, 50, 100, 1000, 10000 });
    run.set_default_samples(10);
#else
    run.set_default_state_iterations({ 100, 1000 });
    run.set_default_samples(3);
#endif

    run.set_compare_results_across_benchmarks(true);
    run.set_compare_results_across_samples(true);

    run.run_benchmarks(123);
    
    auto rep = run.generate_report();

    rep.to_text(std::cout);

    return run.error();
}